

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O3

void __thiscall ConfigParser::ProcessConfiguration(ConfigParser *this,HANDLE hmod)

{
  bool bVar1;
  MemoryLogger *logger;
  StackTraceHelper *helper;
  ConfigParser *this_00;
  WCHAR local_228 [4];
  char16 modulename [260];
  
  GetModuleFileNameW(hmod,local_228,0x104);
  this_00 = (ConfigParser *)&Js::Configuration::Global;
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,OutputFileFlag);
  if ((bVar1) && (DAT_015ada70 != (WCHAR *)0x0)) {
    SetOutputFile(this_00,DAT_015ada70,DAT_015ada78);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (DAT_015962e8 == '\x01') {
    Output::s_useDebuggerWindow = true;
    bVar1 = true;
  }
  if (DAT_015ada80 == '\x01') {
    logger = Js::MemoryLogger::Create(&s_arenaHost1.m_allocator,DAT_015ada84 * 3);
    Output::SetInMemoryLogger(&logger->super_ILogger);
    bVar1 = true;
  }
  if (DAT_015ada88 == '\x01') {
    helper = Js::StackTraceHelper::Create(&s_arenaHost2.m_allocator);
    Output::SetStackTraceHelper(&helper->super_IStackTraceHelper);
  }
  if (bVar1) {
    ConfigParserAPI::DisplayInitialOutput(local_228);
    Output::Print(L"\n");
    Js::ConfigFlagsTable::VerboseDump((ConfigFlagsTable *)&Js::Configuration::Global);
    Output::Flush();
  }
  if (DAT_0159efab == '\x01') {
    DAT_0159efd0 = 1;
    DAT_015991e0 = 1;
  }
  Memory::ForcedMemoryConstraint::Apply();
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015a1f00,AllPhase);
  if (bVar1) {
    Memory::RecyclerMemoryTracking::Activate();
    Memory::PageTracking::Activate();
  }
  else {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015a1f00,RecyclerPhase);
    if (bVar1) {
      Memory::RecyclerMemoryTracking::Activate();
    }
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015a1f00,PageAllocatorPhase);
    if (bVar1) {
      Memory::PageTracking::Activate();
    }
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015a1f00,ArenaPhase);
    if (!bVar1) {
      return;
    }
  }
  Memory::ArenaMemoryTracking::Activate();
  return;
}

Assistant:

void ConfigParser::ProcessConfiguration(HANDLE hmod)
{
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    bool hasOutput = false;
    char16 modulename[_MAX_PATH];

    GetModuleFileName((HMODULE)hmod, modulename, _MAX_PATH);

    // Win32 specific console creation code
    // xplat-todo: Consider having this mechanism available on other
    // platforms
    // Not a pressing need since ChakraCore runs only in consoles by
    // default so we don't need to allocate a second console for this
#if CONFIG_CONSOLE_AVAILABLE
    if (Js::Configuration::Global.flags.Console)
    {
        int fd;
        FILE *fp;

        // fail usually means there is an existing console. We don't really care.
        if (AllocConsole())
        {
            fd = _open_osfhandle((intptr_t)GetStdHandle(STD_OUTPUT_HANDLE), O_TEXT);
            fp = _wfdopen(fd, _u("w"));

            if (fp != nullptr)
            {
                *stdout = *fp;                
                setvbuf(stdout, nullptr, _IONBF, 0);

                fd = _open_osfhandle((intptr_t)GetStdHandle(STD_ERROR_HANDLE), O_TEXT);
                fp = _wfdopen(fd, _u("w"));

                if (fp != nullptr)
                {
                    *stderr = *fp;
                    setvbuf(stderr, nullptr, _IONBF, 0);

                    char16 buffer[_MAX_PATH + 70];

                    if (ConfigParserAPI::FillConsoleTitle(buffer, _MAX_PATH + 20, modulename))
                    {
                        SetConsoleTitle(buffer);
                    }

                    hasOutput = true;
                }
            }
        }
    }
#endif

    if (Js::Configuration::Global.flags.IsEnabled(Js::OutputFileFlag)
        && Js::Configuration::Global.flags.OutputFile != nullptr)
    {
        SetOutputFile(Js::Configuration::Global.flags.OutputFile, Js::Configuration::Global.flags.OutputFileOpenMode);
        hasOutput = true;
    }

    if (Js::Configuration::Global.flags.DebugWindow)
    {
        Output::UseDebuggerWindow();
        hasOutput = true;
    }

#ifdef ENABLE_TRACE
    if (CONFIG_FLAG(InMemoryTrace))
    {
        Output::SetInMemoryLogger(
            Js::MemoryLogger::Create(::GetOutputAllocator1(),
            CONFIG_FLAG(InMemoryTraceBufferSize) * 3));   // With stack each trace is 3 entries (header, msg, stack).
        hasOutput = true;
    }

#ifdef STACK_BACK_TRACE
    if (CONFIG_FLAG(TraceWithStack))
    {
        Output::SetStackTraceHelper(Js::StackTraceHelper::Create(::GetOutputAllocator2()));
    }
#endif // STACK_BACK_TRACE
#endif // ENABLE_TRACE

    if (hasOutput)
    {
        ConfigParserAPI::DisplayInitialOutput(modulename);

        Output::Print(_u("\n"));

        Js::Configuration::Global.flags.VerboseDump();
        Output::Flush();
    }

    if (Js::Configuration::Global.flags.ForceSerialized)
    {
        // Can't generate or execute byte code under forced serialize
        Js::Configuration::Global.flags.GenerateByteCodeBufferReturnsCantGenerate = true;
        Js::Configuration::Global.flags.ExecuteByteCodeBufferReturnsInvalidByteCode = true;
    }

    ForcedMemoryConstraint::Apply();
#endif

#ifdef MEMSPECT_TRACKING
    bool all = false;
    if (Js::Configuration::Global.flags.Memspect.IsEnabled(Js::AllPhase))
    {
        all = true;
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::RecyclerPhase))
    {
        RecyclerMemoryTracking::Activate();
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::PageAllocatorPhase))
    {
        PageTracking::Activate();
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::ArenaPhase))
    {
        ArenaMemoryTracking::Activate();
    }
#endif
}